

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O1

int __thiscall
CVmObjFileName::getp_listDir(CVmObjFileName *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  long lVar1;
  void *pvVar2;
  int iVar3;
  CVmNetFile *this_00;
  dirent *pdVar4;
  uint uVar5;
  long *in_FS_OFFSET;
  err_frame_t err_cur__;
  vm_rcdesc rc;
  uint local_158 [2];
  long local_150;
  void *local_148;
  __jmp_buf_tag local_140;
  vm_rcdesc local_78;
  
  if (oargc == (uint *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = *oargc;
  }
  if (getp_listDir(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_listDir();
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,oargc,&getp_listDir::desc);
  if (iVar3 == 0) {
    CVmMetaclass::get_class_obj(metaclass_reg_);
    vm_rcdesc::init(&local_78,(EVP_PKEY_CTX *)"FileName.listDir");
    this_00 = CVmObjFile::get_filename_from_obj
                        (self,&local_78,0x1004,0xb,"application/octet-stream");
    G_err_frame::__tls_init();
    local_150 = *in_FS_OFFSET;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)local_158;
    local_158[0] = _setjmp(&local_140);
    if ((local_158[0] == 0) &&
       (pdVar4 = CVmNetFile::readdir(this_00,(DIR *)((this->super_CVmObject).ext_ + 8)),
       (int)pdVar4 == 0)) {
      CVmRun::throw_new_class(&G_interpreter_X,G_predef_X.file_open_exc,0,"error reading directory")
      ;
    }
    if (-1 < (short)local_158[0]) {
      local_158[0] = local_158[0] | 0x8000;
      CVmNetFile::abandon(this_00);
    }
    lVar1 = local_150;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = lVar1;
    if ((local_158[0] & 0x4001) != 0) {
      G_err_frame::__tls_init();
      if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
        G_err_frame::__tls_init();
        free(*(void **)(*in_FS_OFFSET + 0x10));
      }
      pvVar2 = local_148;
      G_err_frame::__tls_init();
      *(void **)(*in_FS_OFFSET + 0x10) = pvVar2;
      err_rethrow();
    }
    if ((local_158[0] & 2) != 0) {
      free(local_148);
    }
    sp_ = sp_ + -(long)(int)uVar5;
  }
  return 1;
}

Assistant:

int CVmObjFileName::getp_listDir(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the filename; use the READ DIR access mode */
    vm_rcdesc rc(vmg_ "FileName.listDir",
                 metaclass_reg_->get_class_obj(vmg0_),
                 VMOFN_LISTDIR, G_stk->get(0), argc);
    CVmNetFile *netfile = CVmObjFile::get_filename_from_obj(
        vmg_ self, &rc, VMOBJFILE_ACCESS_READDIR,
        OSFTUNK, "application/octet-stream");
    
    err_try
    {
        /* get the directory listing */
        if (!netfile->readdir(vmg_ get_ext()->get_str(), retval))
            G_interpreter->throw_new_class(vmg_ G_predef->file_open_exc,
                                           0, "error reading directory");
    }